

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::checkNoShaderLayouts
          (TParseContext *this,TSourceLoc *loc,TShaderQualifiers *shaderQualifiers)

{
  TVertexOrder TVar1;
  EShLanguage EVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  switch(shaderQualifiers->geometry) {
  case ElgNone:
    goto switchD_004ad4f1_caseD_0;
  case ElgPoints:
    pcVar3 = "points";
    break;
  case ElgLines:
    pcVar3 = "lines";
    break;
  case ElgLinesAdjacency:
    pcVar3 = "lines_adjacency";
    break;
  case ElgLineStrip:
    pcVar3 = "line_strip";
    break;
  case ElgTriangles:
    pcVar3 = "triangles";
    break;
  case ElgTrianglesAdjacency:
    pcVar3 = "triangles_adjacency";
    break;
  case ElgTriangleStrip:
    pcVar3 = "triangle_strip";
    break;
  case ElgQuads:
    pcVar3 = "quads";
    break;
  case ElgIsolines:
    pcVar3 = "isolines";
    break;
  default:
    pcVar3 = "none";
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"can only apply to a standalone qualifier",pcVar3,"");
switchD_004ad4f1_caseD_0:
  switch(shaderQualifiers->spacing) {
  case EvsNone:
    goto switchD_004ad584_caseD_0;
  case EvsEqual:
    pcVar3 = "equal_spacing";
    break;
  case EvsFractionalEven:
    pcVar3 = "fractional_even_spacing";
    break;
  case EvsFractionalOdd:
    pcVar3 = "fractional_odd_spacing";
    break;
  default:
    pcVar3 = "none";
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"can only apply to a standalone qualifier",pcVar3,"");
switchD_004ad584_caseD_0:
  TVar1 = shaderQualifiers->order;
  if (TVar1 != EvoNone) {
    pcVar3 = "none";
    if (TVar1 == EvoCcw) {
      pcVar3 = "ccw";
    }
    pcVar4 = "cw";
    if (TVar1 != EvoCw) {
      pcVar4 = pcVar3;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar4,"");
  }
  if (shaderQualifiers->pointMode == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","point_mode","");
  }
  if (shaderQualifiers->invocations != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","invocations","");
  }
  lVar5 = -3;
  do {
    if (1 < *(int *)(shaderQualifiers->localSizeNotDefault + lVar5 * 4)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","local_size","");
    }
    if (shaderQualifiers->localSizeSpecId[lVar5 + 3] != -1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to a standalone qualifier","local_size id","");
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  if (shaderQualifiers->vertices != -1) {
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    pcVar3 = "max_vertices";
    if ((EVar2 != EShLangMesh) && (EVar2 != EShLangGeometry)) {
      if (EVar2 != EShLangTessControl) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x1c79,
                      "void glslang::TParseContext::checkNoShaderLayouts(const TSourceLoc &, const TShaderQualifiers &)"
                     );
      }
      pcVar3 = "vertices";
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",pcVar3,"");
  }
  if (shaderQualifiers->earlyFragmentTests == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","early_fragment_tests","");
  }
  if (shaderQualifiers->postDepthCoverage == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","post_depth_coverage","");
  }
  if (shaderQualifiers->nonCoherentColorAttachmentReadEXT == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_color_attachment_readEXT","");
  }
  if (shaderQualifiers->nonCoherentDepthAttachmentReadEXT == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_depth_attachment_readEXT","");
  }
  if (shaderQualifiers->nonCoherentStencilAttachmentReadEXT == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier",
               "non_coherent_stencil_attachment_readEXT","");
  }
  if (shaderQualifiers->primitives != -1) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x1c89,
                    "void glslang::TParseContext::checkNoShaderLayouts(const TSourceLoc &, const TShaderQualifiers &)"
                   );
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","max_primitives","");
  }
  if (shaderQualifiers->blendEquation == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","blend equation","");
  }
  if (shaderQualifiers->numViews != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to a standalone qualifier","num_views","");
  }
  switch(shaderQualifiers->interlockOrdering) {
  case EioNone:
    goto switchD_004ad8c8_caseD_0;
  case EioPixelInterlockOrdered:
    pcVar3 = "pixel_interlock_ordered";
    break;
  case EioPixelInterlockUnordered:
    pcVar3 = "pixel_interlock_unordered";
    break;
  case EioSampleInterlockOrdered:
    pcVar3 = "sample_interlock_ordered";
    break;
  case EioSampleInterlockUnordered:
    pcVar3 = "sample_interlock_unordered";
    break;
  case EioShadingRateInterlockOrdered:
    pcVar3 = "shading_rate_interlock_ordered";
    break;
  case EioShadingRateInterlockUnordered:
    pcVar3 = "shading_rate_interlock_unordered";
    break;
  default:
    pcVar3 = "none";
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"can only apply to a standalone qualifier",pcVar3,"");
switchD_004ad8c8_caseD_0:
  if (shaderQualifiers->layoutPrimitiveCulling != true) {
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,"can only be applied as standalone","primitive_culling","",
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::checkNoShaderLayouts(const TSourceLoc& loc, const TShaderQualifiers& shaderQualifiers)
{
    const char* message = "can only apply to a standalone qualifier";

    if (shaderQualifiers.geometry != ElgNone)
        error(loc, message, TQualifier::getGeometryString(shaderQualifiers.geometry), "");
    if (shaderQualifiers.spacing != EvsNone)
        error(loc, message, TQualifier::getVertexSpacingString(shaderQualifiers.spacing), "");
    if (shaderQualifiers.order != EvoNone)
        error(loc, message, TQualifier::getVertexOrderString(shaderQualifiers.order), "");
    if (shaderQualifiers.pointMode)
        error(loc, message, "point_mode", "");
    if (shaderQualifiers.invocations != TQualifier::layoutNotSet)
        error(loc, message, "invocations", "");
    for (int i = 0; i < 3; ++i) {
        if (shaderQualifiers.localSize[i] > 1)
            error(loc, message, "local_size", "");
        if (shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet)
            error(loc, message, "local_size id", "");
    }
    if (shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        if (language == EShLangGeometry || language == EShLangMesh)
            error(loc, message, "max_vertices", "");
        else if (language == EShLangTessControl)
            error(loc, message, "vertices", "");
        else
            assert(0);
    }
    if (shaderQualifiers.earlyFragmentTests)
        error(loc, message, "early_fragment_tests", "");
    if (shaderQualifiers.postDepthCoverage)
        error(loc, message, "post_depth_coverage", "");
    if (shaderQualifiers.nonCoherentColorAttachmentReadEXT)
        error(loc, message, "non_coherent_color_attachment_readEXT", "");
    if (shaderQualifiers.nonCoherentDepthAttachmentReadEXT)
        error(loc, message, "non_coherent_depth_attachment_readEXT", "");
    if (shaderQualifiers.nonCoherentStencilAttachmentReadEXT)
        error(loc, message, "non_coherent_stencil_attachment_readEXT", "");
    if (shaderQualifiers.primitives != TQualifier::layoutNotSet) {
        if (language == EShLangMesh)
            error(loc, message, "max_primitives", "");
        else
            assert(0);
    }
    if (shaderQualifiers.hasBlendEquation())
        error(loc, message, "blend equation", "");
    if (shaderQualifiers.numViews != TQualifier::layoutNotSet)
        error(loc, message, "num_views", "");
    if (shaderQualifiers.interlockOrdering != EioNone)
        error(loc, message, TQualifier::getInterlockOrderingString(shaderQualifiers.interlockOrdering), "");
    if (shaderQualifiers.layoutPrimitiveCulling)
        error(loc, "can only be applied as standalone", "primitive_culling", "");
}